

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * kratos::fs::which(string *__return_storage_ptr__,string *name)

{
  int iVar1;
  pointer pcVar2;
  char *__s;
  undefined1 path1 [8];
  undefined1 local_280 [8];
  ifstream in;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  int aiStack_260 [122];
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  undefined1 local_50 [8];
  string env_path;
  
  local_50 = (undefined1  [8])&env_path._M_string_length;
  env_path._M_dataplus._M_p = (pointer)0x0;
  env_path._M_string_length._0_1_ = 0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = name;
  __s = getenv("PATH");
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)0x0,(ulong)__s);
  local_280 = (undefined1  [8])&local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,";:","");
  string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,(string *)local_50,(string *)local_280);
  if (local_280 != (undefined1  [8])&local_270) {
    operator_delete((void *)local_280,local_270._M_allocated_capacity + 1);
  }
  if (local_78 !=
      (undefined1  [8])
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    path1 = local_78;
    do {
      join(__return_storage_ptr__,(string *)path1,
           tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ifstream::ifstream(local_280,(string *)__return_storage_ptr__,_S_in);
      iVar1 = *(int *)((long)aiStack_260 + *(long *)((long)local_280 + -0x18));
      std::ifstream::~ifstream(local_280);
      if (iVar1 == 0) goto LAB_001cca25;
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar2,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
      }
      path1 = (undefined1  [8])((long)path1 + 0x20);
    } while (path1 != (undefined1  [8])
                      tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_001cca25:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  if (local_50 != (undefined1  [8])&env_path._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(env_path._M_string_length._1_7_,(undefined1)env_path._M_string_length)
                    + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string which(const std::string &name) {
    // windows is more picky
    std::string env_path;
#ifdef _WIN32
    char *path_var;
    size_t len;
    auto err = _dupenv_s(&path_var, &len, "PATH");
    if (err) {
        env_path = "";
    }
    env_path = std::string(path_var);
    free(path_var);
    path_var = nullptr;
#else
    env_path = std::getenv("PATH");
#endif
    // tokenize it base on either : or ;
    auto tokens = string::get_tokens(env_path, ";:");
    for (auto const &dir : tokens) {
        auto new_path = fs::join(dir, name);
        if (exists(new_path)) {
            return new_path;
        }
    }
    return "";
}